

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O2

void __thiscall TTD::SnapShot::Inflate(SnapShot *this,InflateMap *inflator,ThreadContextTTD *tCtx)

{
  PropertyId propertyId;
  FunctionBodyResolveInfo *pFVar1;
  SnapObject *pSVar2;
  SnapPrimitiveValue *pSVar3;
  SlotArrayInfo *pSVar4;
  ScriptFunctionScopeInfo *pSVar5;
  fPtr_DoAddtlValueInstantiation p_Var6;
  SnapContext *pSVar7;
  PropertyId *pPVar8;
  UnorderedArrayListLink *pUVar9;
  UnorderedArrayListLink *pUVar10;
  undefined8 *puVar11;
  UnorderedArrayListLink *pUVar12;
  UnorderedArrayListLink *pUVar13;
  UnorderedArrayListLink *pUVar14;
  _func_int **pp_Var15;
  UnorderedArrayListLink *pUVar16;
  UnorderedArrayListLink *pUVar17;
  bool bVar18;
  uint32 uVar19;
  UnorderedArrayListLink *pUVar20;
  UnorderedArrayListLink *pUVar21;
  UnorderedArrayListLink *pUVar22;
  UnorderedArrayListLink *pUVar23;
  Type *value;
  UnorderedArrayListLink *pUVar24;
  FrameDisplay *value_00;
  _func_int **pp_Var25;
  RecyclableObject *obj;
  DynamicObject *obj_00;
  UnorderedArrayListLink *pUVar26;
  ScriptContext *intoCtx;
  ThreadContext *pTVar27;
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  UnorderedArrayListLink *pUVar28;
  Recycler *alloc;
  HashedCharacterBuffer<char16_t> *this_01;
  SnapPrimitiveValue *pSnap;
  UnorderedArrayListLink **ppUVar29;
  UnorderedArrayListLink **ppUVar30;
  SnapPrimitiveValue *snapValue;
  SlotArrayInfo *slotInfo;
  ScriptFunctionScopeInfo *funcScopeInfo;
  SnapContext *snpCtx;
  FunctionBodyResolveInfo *fbInfo;
  SnapPrimitiveValue *pSVar31;
  SlotArrayInfo *pSVar32;
  ScriptFunctionScopeInfo *pSVar33;
  SnapContext *pSVar34;
  PropertyId *pPVar35;
  FunctionBodyResolveInfo *pFVar36;
  UnorderedArrayListLink **ppUVar37;
  UnorderedArrayListLink **ppUVar38;
  SnapObject *pSVar39;
  UnorderedArrayListLink **ppUVar40;
  PropertyId *pPVar41;
  FunctionBodyResolveInfo *pFVar42;
  SnapObject *pSVar43;
  undefined8 *puVar44;
  UnorderedArrayListLink **ppUVar45;
  UnorderedArrayListLink **ppUVar46;
  HashedCharacterBuffer<char16_t> *local_c8;
  HashedCharacterBuffer<char16_t> *propertyName;
  TrackAllocData data;
  undefined1 local_90 [8];
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
  idToSnpBodyMap;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> idToSnpObjectMap;
  PropertyRecord *pRecord;
  
  local_90._0_4_ = 0;
  local_90._4_4_ = 0;
  idToSnpBodyMap.m_h1Prime = 0;
  idToSnpBodyMap.m_capacity = 0;
  idToSnpBodyMap._12_4_ = 0;
  idToSnpBodyMap.m_hashArray._0_4_ = 0;
  uVar19 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Count
                     (&this->m_functionBodyList);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>::Initialize
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*> *
             )local_90,uVar19);
  pFVar36 = (this->m_functionBodyList).m_inlineHeadBlock.CurrPos;
  pFVar1 = (this->m_functionBodyList).m_inlineHeadBlock.BlockData;
  pFVar42 = (FunctionBodyResolveInfo *)0x0;
  if (pFVar1 != pFVar36) {
    pFVar42 = pFVar1;
  }
  ppUVar29 = &(this->m_functionBodyList).m_inlineHeadBlock.Next;
  data._32_8_ = ppUVar29;
  do {
    pUVar9 = *ppUVar29;
    do {
      do {
        pUVar20 = pUVar9;
        if (pFVar42 == (FunctionBodyResolveInfo *)0x0) {
          idToSnpBodyMap.m_count = 0;
          idToSnpBodyMap._28_4_ = 0;
          idToSnpObjectMap.m_h1Prime = 0;
          idToSnpObjectMap.m_capacity = 0;
          idToSnpObjectMap._12_4_ = 0;
          idToSnpObjectMap.m_hashArray._0_4_ = 0;
          uVar19 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                             (&this->m_compoundObjectList);
          TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>::Initialize
                    ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> *)
                     &idToSnpBodyMap.m_count,uVar19);
          pSVar39 = (this->m_compoundObjectList).m_inlineHeadBlock.CurrPos;
          pSVar2 = (this->m_compoundObjectList).m_inlineHeadBlock.BlockData;
          pSVar43 = (SnapObject *)0x0;
          if (pSVar2 != pSVar39) {
            pSVar43 = pSVar2;
          }
          pRecord = (PropertyRecord *)&(this->m_compoundObjectList).m_inlineHeadBlock.Next;
          ppUVar30 = (UnorderedArrayListLink **)pRecord;
          do {
            pUVar10 = *ppUVar30;
            do {
              do {
                pUVar21 = pUVar10;
                if (pSVar43 == (SnapObject *)0x0) {
                  pFVar36 = (this->m_functionBodyList).m_inlineHeadBlock.CurrPos;
                  pFVar1 = (this->m_functionBodyList).m_inlineHeadBlock.BlockData;
                  pFVar42 = (FunctionBodyResolveInfo *)0x0;
                  if (pFVar1 != pFVar36) {
                    pFVar42 = pFVar1;
                  }
                  puVar44 = (undefined8 *)data._32_8_;
                  do {
                    puVar11 = (undefined8 *)*puVar44;
                    do {
                      do {
                        puVar44 = puVar11;
                        if (pFVar42 == (FunctionBodyResolveInfo *)0x0) {
                          pSVar31 = (this->m_primitiveObjectList).m_inlineHeadBlock.CurrPos;
                          pSVar3 = (this->m_primitiveObjectList).m_inlineHeadBlock.BlockData;
                          ppUVar45 = &(this->m_primitiveObjectList).m_inlineHeadBlock.Next;
                          snapValue = (SnapPrimitiveValue *)0x0;
                          if (pSVar3 != pSVar31) {
                            snapValue = pSVar3;
                          }
                          do {
                            pUVar12 = *ppUVar45;
                            do {
                              do {
                                pUVar22 = pUVar12;
                                if (snapValue == (SnapPrimitiveValue *)0x0) {
                                  pSVar39 = (this->m_compoundObjectList).m_inlineHeadBlock.CurrPos;
                                  pSVar2 = (this->m_compoundObjectList).m_inlineHeadBlock.BlockData;
                                  pSVar43 = (SnapObject *)0x0;
                                  if (pSVar2 != pSVar39) {
                                    pSVar43 = pSVar2;
                                  }
                                  ppUVar30 = (UnorderedArrayListLink **)pRecord;
                                  do {
                                    pUVar10 = *ppUVar30;
                                    do {
                                      do {
                                        pUVar21 = pUVar10;
                                        if (pSVar43 == (SnapObject *)0x0) {
                                          pSVar32 = (this->m_slotArrayEntries).m_inlineHeadBlock.
                                                    CurrPos;
                                          pSVar4 = (this->m_slotArrayEntries).m_inlineHeadBlock.
                                                   BlockData;
                                          ppUVar37 = &(this->m_slotArrayEntries).m_inlineHeadBlock.
                                                      Next;
                                          slotInfo = (SlotArrayInfo *)0x0;
                                          if (pSVar4 != pSVar32) {
                                            slotInfo = pSVar4;
                                          }
                                          do {
                                            pUVar13 = *ppUVar37;
                                            do {
                                              do {
                                                pUVar23 = pUVar13;
                                                if (slotInfo == (SlotArrayInfo *)0x0) {
                                                  pSVar33 = (this->m_scopeEntries).m_inlineHeadBlock
                                                            .CurrPos;
                                                  pSVar5 = (this->m_scopeEntries).m_inlineHeadBlock.
                                                           BlockData;
                                                  ppUVar38 = &(this->m_scopeEntries).
                                                              m_inlineHeadBlock.Next;
                                                  funcScopeInfo = (ScriptFunctionScopeInfo *)0x0;
                                                  if (pSVar5 != pSVar33) {
                                                    funcScopeInfo = pSVar5;
                                                  }
                                                  do {
                                                    pUVar14 = *ppUVar38;
                                                    do {
                                                      do {
                                                        pUVar24 = pUVar14;
                                                        if (funcScopeInfo ==
                                                            (ScriptFunctionScopeInfo *)0x0) {
                                                          pSVar39 = (this->m_compoundObjectList).
                                                                    m_inlineHeadBlock.CurrPos;
                                                          pSVar2 = (this->m_compoundObjectList).
                                                                   m_inlineHeadBlock.BlockData;
                                                          pSVar43 = (SnapObject *)0x0;
                                                          if (pSVar2 != pSVar39) {
                                                            pSVar43 = pSVar2;
                                                          }
                                                          do {
                                                            pp_Var15 = (pRecord->
                                                                       super_FinalizableObject).
                                                                       super_IRecyclerVisitedObject.
                                                                       _vptr_IRecyclerVisitedObject;
                                                            do {
                                                              do {
                                                                pp_Var25 = pp_Var15;
                                                                if (pSVar43 == (SnapObject *)0x0) {
                                                                  ReLinkThreadContextInfo
                                                                            (this,inflator,tCtx);
                                                                  pSVar34 = (this->m_ctxList).
                                                                            m_inlineHeadBlock.
                                                                            CurrPos;
                                                                  pSVar7 = (this->m_ctxList).
                                                                           m_inlineHeadBlock.
                                                                           BlockData;
                                                                  ppUVar40 = &(this->m_ctxList).
                                                                              m_inlineHeadBlock.Next
                                                                  ;
                                                                  snpCtx = (SnapContext *)0x0;
                                                                  if (pSVar7 != pSVar34) {
                                                                    snpCtx = pSVar7;
                                                                  }
                                                                  do {
                                                                    pUVar16 = *ppUVar40;
                                                                    do {
                                                                      do {
                                                                        pUVar26 = pUVar16;
                                                                        if (snpCtx == (SnapContext *
                                                                                      )0x0) {
                                                                          pTVar27 = ThreadContextTTD
                                                                                    ::
                                                  GetThreadContext(tCtx);
                                                  this_00 = ThreadContext::
                                                            GetSymbolRegistrationMap_TTD(pTVar27);
                                                  JsUtil::
                                                  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                                  ::Clear(this_00);
                                                  pPVar35 = (this->m_tcSymbolRegistrationMapContents
                                                            ).m_inlineHeadBlock.CurrPos;
                                                  pPVar8 = (this->m_tcSymbolRegistrationMapContents)
                                                           .m_inlineHeadBlock.BlockData;
                                                  ppUVar46 = &(this->
                                                  m_tcSymbolRegistrationMapContents).
                                                  m_inlineHeadBlock.Next;
                                                  pPVar41 = (PropertyId *)0x0;
                                                  if (pPVar8 != pPVar35) {
                                                    pPVar41 = pPVar8;
                                                  }
                                                  do {
                                                    pUVar17 = *ppUVar46;
                                                    do {
                                                      do {
                                                        pUVar28 = pUVar17;
                                                        if (pPVar41 == (PropertyId *)0x0) {
                                                                                                                    
                                                  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>
                                                  ::~TTDIdentifierDictionary
                                                            ((
                                                  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>
                                                  *)&idToSnpBodyMap.m_count);
                                                  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
                                                  ::~TTDIdentifierDictionary
                                                            ((
                                                  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
                                                  *)local_90);
                                                  return;
                                                  }
                                                  propertyId = *pPVar41;
                                                  pTVar27 = ThreadContextTTD::GetThreadContext(tCtx)
                                                  ;
                                                  idToSnpObjectMap._24_8_ =
                                                       ThreadContext::GetPropertyName
                                                                 (pTVar27,propertyId);
                                                  pTVar27 = ThreadContextTTD::GetThreadContext(tCtx)
                                                  ;
                                                  propertyName = (HashedCharacterBuffer<char16_t> *)
                                                                 &Js::
                                                  HashedCharacterBuffer<char16_t>::typeinfo;
                                                  data.typeinfo = (type_info *)0x0;
                                                  data.plusSize = 0xffffffffffffffff;
                                                  data.count = (size_t)anon_var_dwarf_41f0bd1;
                                                  data.filename._0_4_ = 0x275;
                                                  alloc = Memory::Recycler::TrackAllocInfo
                                                                    (pTVar27->recycler,
                                                                     (TrackAllocData *)&propertyName
                                                                    );
                                                  this_01 = (HashedCharacterBuffer<char16_t> *)
                                                            new<Memory::Recycler>
                                                                      (0x10,alloc,0x37a1d4);
                                                  Js::HashedCharacterBuffer<char16_t>::
                                                  HashedCharacterBuffer
                                                            (this_01,(char16_t *)
                                                                     (idToSnpObjectMap._24_8_ + 0x18
                                                                     ),
                                                             *(uint *)(idToSnpObjectMap._24_8_ +
                                                                      0x14) >> 1);
                                                  local_c8 = this_01;
                                                  JsUtil::
                                                  BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  ::
                                                  Insert<(JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                                                            ((
                                                  BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                                  *)this_00,&local_c8,
                                                  (PropertyRecord **)&idToSnpObjectMap.m_count);
                                                  pPVar41 = pPVar41 + 1;
                                                  pUVar17 = pUVar28;
                                                  } while (pPVar41 != pPVar35);
                                                  pPVar41 = (PropertyId *)0x0;
                                                  pUVar17 = (UnorderedArrayListLink *)0x0;
                                                  } while (pUVar28 == (UnorderedArrayListLink *)0x0)
                                                  ;
                                                  pPVar35 = pUVar28->CurrPos;
                                                  pPVar41 = pUVar28->BlockData;
                                                  ppUVar46 = &pUVar28->Next;
                                                  } while( true );
                                                  }
                                                  intoCtx = InflateMap::LookupScriptContext
                                                                      (inflator,snpCtx->
                                                  ScriptContextLogId);
                                                  NSSnapValues::ResetPendingAsyncBufferModInfo
                                                            (snpCtx,intoCtx,inflator);
                                                  snpCtx = snpCtx + 1;
                                                  pUVar16 = pUVar26;
                                                  } while (snpCtx != pSVar34);
                                                  snpCtx = (SnapContext *)0x0;
                                                  pUVar16 = (UnorderedArrayListLink *)0x0;
                                                  } while (pUVar26 == (UnorderedArrayListLink *)0x0)
                                                  ;
                                                  pSVar34 = pUVar26->CurrPos;
                                                  snpCtx = pUVar26->BlockData;
                                                  ppUVar40 = &pUVar26->Next;
                                                  } while( true );
                                                  }
                                                  obj = InflateMap::LookupObject
                                                                  (inflator,pSVar43->ObjectPtrId);
                                                  p_Var6 = this->m_snapObjectVTableArray
                                                           [pSVar43->SnapObjectTag].
                                                           AddtlInstationationFunc;
                                                  if (p_Var6 != (fPtr_DoAddtlValueInstantiation)0x0)
                                                  {
                                                    (*p_Var6)(pSVar43,obj,inflator);
                                                  }
                                                  bVar18 = Js::DynamicType::Is(pSVar43->SnapType->
                                                                               JsTypeId);
                                                  if (bVar18) {
                                                    obj_00 = Js::
                                                  VarTo<Js::DynamicObject,Js::RecyclableObject>(obj)
                                                  ;
                                                  NSSnapObjects::StdPropertyRestore
                                                            (pSVar43,obj_00,inflator);
                                                  }
                                                  pSVar43 = pSVar43 + 1;
                                                  pp_Var15 = pp_Var25;
                                                  } while (pSVar43 != pSVar39);
                                                  pSVar43 = (SnapObject *)0x0;
                                                  pp_Var15 = (_func_int **)0x0;
                                                  } while (pp_Var25 == (_func_int **)0x0);
                                                  pSVar39 = (SnapObject *)*pp_Var25;
                                                  pSVar43 = (SnapObject *)pp_Var25[2];
                                                  pRecord = (PropertyRecord *)(pp_Var25 + 3);
                                                  } while( true );
                                                  }
                                                  value_00 = NSSnapValues::
                                                             InflateScriptFunctionScopeInfo
                                                                       (funcScopeInfo,inflator);
                                                  InflateMap::AddEnvironment
                                                            (inflator,funcScopeInfo->ScopeId,
                                                             value_00);
                                                  funcScopeInfo = funcScopeInfo + 1;
                                                  pUVar14 = pUVar24;
                                                  } while (funcScopeInfo != pSVar33);
                                                  funcScopeInfo = (ScriptFunctionScopeInfo *)0x0;
                                                  pUVar14 = (UnorderedArrayListLink *)0x0;
                                                  } while (pUVar24 == (UnorderedArrayListLink *)0x0)
                                                  ;
                                                  pSVar33 = pUVar24->CurrPos;
                                                  funcScopeInfo = pUVar24->BlockData;
                                                  ppUVar38 = &pUVar24->Next;
                                                  } while( true );
                                                }
                                                value = NSSnapValues::InflateSlotArrayInfo
                                                                  (slotInfo,inflator);
                                                InflateMap::AddSlotArray
                                                          (inflator,slotInfo->SlotId,value);
                                                slotInfo = slotInfo + 1;
                                                pUVar13 = pUVar23;
                                              } while (slotInfo != pSVar32);
                                              slotInfo = (SlotArrayInfo *)0x0;
                                              pUVar13 = (UnorderedArrayListLink *)0x0;
                                            } while (pUVar23 == (UnorderedArrayListLink *)0x0);
                                            pSVar32 = pUVar23->CurrPos;
                                            slotInfo = pUVar23->BlockData;
                                            ppUVar37 = &pUVar23->Next;
                                          } while( true );
                                        }
                                        InflateSingleObject(this,pSVar43,inflator,
                                                            (
                                                  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>
                                                  *)&idToSnpBodyMap.m_count);
                                        pSVar43 = pSVar43 + 1;
                                        pUVar10 = pUVar21;
                                      } while (pSVar43 != pSVar39);
                                      pSVar43 = (SnapObject *)0x0;
                                      pUVar10 = (UnorderedArrayListLink *)0x0;
                                    } while (pUVar21 == (UnorderedArrayListLink *)0x0);
                                    pSVar39 = pUVar21->CurrPos;
                                    pSVar43 = pUVar21->BlockData;
                                    ppUVar30 = &pUVar21->Next;
                                  } while( true );
                                }
                                NSSnapValues::InflateSnapPrimitiveValue(snapValue,inflator);
                                snapValue = snapValue + 1;
                                pUVar12 = pUVar22;
                              } while (snapValue != pSVar31);
                              snapValue = (SnapPrimitiveValue *)0x0;
                              pUVar12 = (UnorderedArrayListLink *)0x0;
                            } while (pUVar22 == (UnorderedArrayListLink *)0x0);
                            pSVar31 = pUVar22->CurrPos;
                            snapValue = pUVar22->BlockData;
                            ppUVar45 = &pUVar22->Next;
                          } while( true );
                        }
                        NSSnapValues::InflateFunctionBody
                                  (pFVar42,inflator,
                                   (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
                                    *)local_90);
                        pFVar42 = pFVar42 + 1;
                        puVar11 = puVar44;
                      } while (pFVar42 != pFVar36);
                      pFVar42 = (FunctionBodyResolveInfo *)0x0;
                      puVar11 = (undefined8 *)0x0;
                    } while (puVar44 == (undefined8 *)0x0);
                    pFVar36 = (FunctionBodyResolveInfo *)*puVar44;
                    pFVar42 = (FunctionBodyResolveInfo *)puVar44[2];
                    puVar44 = puVar44 + 3;
                  } while( true );
                }
                propertyName = (HashedCharacterBuffer<char16_t> *)pSVar43;
                TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>::AddItem
                          ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>
                            *)&idToSnpBodyMap.m_count,pSVar43->ObjectPtrId,
                           (SnapObject **)&propertyName);
                pSVar43 = pSVar43 + 1;
                pUVar10 = pUVar21;
              } while (pSVar43 != pSVar39);
              pSVar43 = (SnapObject *)0x0;
              pUVar10 = (UnorderedArrayListLink *)0x0;
            } while (pUVar21 == (UnorderedArrayListLink *)0x0);
            pSVar39 = pUVar21->CurrPos;
            pSVar43 = pUVar21->BlockData;
            ppUVar30 = &pUVar21->Next;
          } while( true );
        }
        propertyName = (HashedCharacterBuffer<char16_t> *)pFVar42;
        TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>::
        AddItem((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
                 *)local_90,pFVar42->FunctionBodyId,(FunctionBodyResolveInfo **)&propertyName);
        pFVar42 = pFVar42 + 1;
        pUVar9 = pUVar20;
      } while (pFVar42 != pFVar36);
      pFVar42 = (FunctionBodyResolveInfo *)0x0;
      pUVar9 = (UnorderedArrayListLink *)0x0;
    } while (pUVar20 == (UnorderedArrayListLink *)0x0);
    pFVar36 = pUVar20->CurrPos;
    pFVar42 = pUVar20->BlockData;
    ppUVar29 = &pUVar20->Next;
  } while( true );
}

Assistant:

void SnapShot::Inflate(InflateMap* inflator, ThreadContextTTD* tCtx) const
    {
        //We assume the caller has inflated all of the ScriptContexts for us and we are just filling in the objects

        ////

        //set the map from all function body ids to their snap representations
        TTDIdentifierDictionary<TTD_PTR_ID, NSSnapValues::FunctionBodyResolveInfo*> idToSnpBodyMap;
        idToSnpBodyMap.Initialize(this->m_functionBodyList.Count());

        for(auto iter = this->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            idToSnpBodyMap.AddItem(iter.Current()->FunctionBodyId, iter.Current());
        }

        //set the map from all compound object ids to their snap representations
        TTDIdentifierDictionary<TTD_PTR_ID, NSSnapObjects::SnapObject*> idToSnpObjectMap;
        idToSnpObjectMap.Initialize(this->m_compoundObjectList.Count());

        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            idToSnpObjectMap.AddItem(iter.Current()->ObjectPtrId, iter.Current());
        }

        ////

        //inflate all the function bodies
        for(auto iter = this->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::FunctionBodyResolveInfo* fbInfo = iter.Current();
            NSSnapValues::InflateFunctionBody(fbInfo, inflator, idToSnpBodyMap);
        }

        //inflate all the primitive objects
        for(auto iter = this->m_primitiveObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapPrimitiveValue* pSnap = iter.Current();
            NSSnapValues::InflateSnapPrimitiveValue(pSnap, inflator);
        }

        //inflate all the regular objects
        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapObjects::SnapObject* sObj = iter.Current();
            this->InflateSingleObject(sObj, inflator, idToSnpObjectMap);
        }

        //take care of all the slot arrays
        for(auto iter = this->m_slotArrayEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SlotArrayInfo* sai = iter.Current();
            Field(Js::Var)* slots = NSSnapValues::InflateSlotArrayInfo(sai, inflator);

            inflator->AddSlotArray(sai->SlotId, slots);
        }

        //and the scope entries
        for(auto iter = this->m_scopeEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::ScriptFunctionScopeInfo* sfsi = iter.Current();
            Js::FrameDisplay* frame = NSSnapValues::InflateScriptFunctionScopeInfo(sfsi, inflator);

            inflator->AddEnvironment(sfsi->ScopeId, frame);
        }

        //Link up the object pointers
        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapObjects::SnapObject* sobj = iter.Current();
            Js::RecyclableObject* iobj = inflator->LookupObject(sobj->ObjectPtrId);

            NSSnapObjects::fPtr_DoAddtlValueInstantiation addtlInstFPtr = this->m_snapObjectVTableArray[(uint32)sobj->SnapObjectTag].AddtlInstationationFunc;
            if(addtlInstFPtr != nullptr)
            {
                addtlInstFPtr(sobj, iobj, inflator);
            }

            if(Js::DynamicType::Is(sobj->SnapType->JsTypeId))
            {
                NSSnapObjects::StdPropertyRestore(sobj, Js::VarTo<Js::DynamicObject>(iobj), inflator);
            }
        }

        this->ReLinkThreadContextInfo(inflator, tCtx);

        for(auto iter = this->m_ctxList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapContext* snpCtx = iter.Current();
            Js::ScriptContext* sctx = inflator->LookupScriptContext(snpCtx->ScriptContextLogId);

            NSSnapValues::ResetPendingAsyncBufferModInfo(snpCtx, sctx, inflator);
        }

        //reset the threadContext symbol map
        JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16>*, const Js::PropertyRecord*, Recycler, PowerOf2SizePolicy, Js::PropertyRecordStringHashComparer>* tcSymbolRegistrationMap = tCtx->GetThreadContext()->GetSymbolRegistrationMap_TTD();
        tcSymbolRegistrationMap->Clear();

        for(auto iter = this->m_tcSymbolRegistrationMapContents.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            Js::PropertyId pid = *iter.Current();
            const Js::PropertyRecord* pRecord = tCtx->GetThreadContext()->GetPropertyName(pid);
            Js::HashedCharacterBuffer<char16> * propertyName = RecyclerNew(tCtx->GetThreadContext()->GetRecycler(), Js::HashedCharacterBuffer<char16>, pRecord->GetBuffer(), pRecord->GetLength());

            tcSymbolRegistrationMap->Add(propertyName, pRecord);
        }
    }